

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateAccessorDeclarations
          (MapFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()
            ((Formatter *)local_50,
             "private:\nconst ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n    ${1$_internal_$name$$}$() const;\n::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n    ${1$_internal_mutable_$name$$}$();\npublic:\n$deprecated_attr$const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n    ${1$$name$$}$() const;\n$deprecated_attr$::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n    ${1$mutable_$name$$}$();\n"
             ,&(this->super_FieldGenerator).descriptor_);
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MapFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "private:\n"
      "const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n"
      "    ${1$_internal_$name$$}$() const;\n"
      "::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n"
      "    ${1$_internal_mutable_$name$$}$();\n"
      "public:\n"
      "$deprecated_attr$const ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >&\n"
      "    ${1$$name$$}$() const;\n"
      "$deprecated_attr$::$proto_ns$::Map< $key_cpp$, $val_cpp$ >*\n"
      "    ${1$mutable_$name$$}$();\n",
      descriptor_);
}